

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::
CartesianProductGenerator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_int,_int>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_>::ComputeCurrentValue
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *this)

{
  undefined8 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  undefined4 *puVar5;
  undefined4 *puVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  tuple<double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_int,_int>
  *__tmp;
  
  bVar2 = AtEnd(this);
  if (!bVar2) {
    puVar3 = (undefined8 *)
             (**(code **)(*(long *)(this->current_).
                                   super__Tuple_impl<0UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                                   .
                                   super__Head_base<0UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_false>
                                   ._M_head_impl.impl_._M_t.
                                   super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_std::default_delete<testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_>_>
                                   .
                                   super__Head_base<0UL,_testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_*,_false>
                         + 0x28))();
    puVar4 = (undefined8 *)
             (**(code **)(*(long *)(this->current_).
                                   super__Tuple_impl<0UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                                   .
                                   super__Tuple_impl<1UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                                   .
                                   super__Head_base<1UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_false>
                                   ._M_head_impl.impl_._M_t.
                                   super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_std::default_delete<testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_>_>
                                   .
                                   super__Head_base<0UL,_testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_*,_false>
                         + 0x28))();
    puVar5 = (undefined4 *)
             (**(code **)(*(long *)(this->current_).
                                   super__Tuple_impl<0UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                                   .
                                   super__Tuple_impl<1UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                                   .
                                   super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                                   .
                                   super__Head_base<2UL,_testing::internal::ParamIterator<int>,_false>
                                   ._M_head_impl.impl_._M_t.
                                   super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                                   .
                                   super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>
                         + 0x28))();
    puVar6 = (undefined4 *)
             (**(code **)(*(long *)(this->current_).
                                   super__Tuple_impl<0UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                                   .
                                   super__Tuple_impl<1UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                                   .
                                   super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                                   .super__Tuple_impl<3UL,_testing::internal::ParamIterator<int>_>.
                                   super__Head_base<3UL,_testing::internal::ParamIterator<int>,_false>
                                   ._M_head_impl.impl_ + 0x28))();
    p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
    p_Var7->_M_use_count = 1;
    p_Var7->_M_weak_count = 1;
    p_Var7->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_01058150;
    *(undefined4 *)&p_Var7[1]._vptr__Sp_counted_base = *puVar6;
    *(undefined4 *)((long)&p_Var7[1]._vptr__Sp_counted_base + 4) = *puVar5;
    uVar1 = *puVar4;
    p_Var7[1]._M_use_count = (int)uVar1;
    p_Var7[1]._M_weak_count = (int)((ulong)uVar1 >> 0x20);
    p_Var7[2]._vptr__Sp_counted_base = (_func_int **)*puVar3;
    (this->current_value_).
    super___shared_ptr<std::tuple<double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_int,_int>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)(p_Var7 + 1);
    this_00 = (this->current_value_).
              super___shared_ptr<std::tuple<double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_int,_int>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    (this->current_value_).
    super___shared_ptr<std::tuple<double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_int,_int>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var7;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      return;
    }
  }
  return;
}

Assistant:

void ComputeCurrentValue() {
      if (!AtEnd())
        current_value_ = std::make_shared<ParamType>(*std::get<I>(current_)...);
    }